

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

void __thiscall Catch::TestSpecParser::processNameChar(TestSpecParser *this,char c)

{
  int iVar1;
  
  if (c == '[') {
    iVar1 = std::__cxx11::string::compare((char *)&this->m_substring);
    if (iVar1 == 0) {
      this->m_exclusion = true;
    }
    else {
      endMode(this);
    }
    this->m_mode = Tag;
  }
  return;
}

Assistant:

void TestSpecParser::processNameChar( char c ) {
        if( c == '[' ) {
            if( m_substring == "exclude:" )
                m_exclusion = true;
            else
                endMode();
            startNewMode( Tag );
        }
    }